

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall randomx::JitCompilerX86::h_CBRANCH(JitCompilerX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  reference pvVar5;
  byte bVar6;
  int in_EDX;
  Instruction *in_RSI;
  JitCompilerX86 *in_RDI;
  uint j;
  uint32_t imm;
  int shift;
  int target;
  int reg;
  uint8_t (*in_stack_ffffffffffffffc8) [2];
  uint local_28;
  
  bVar1 = in_RSI->dst;
  iVar2 = in_RDI->registerUsage[(int)(uint)bVar1];
  emit<2ul>(in_RDI,in_stack_ffffffffffffffc8);
  emitByte(in_RDI,bVar1 - 0x40);
  iVar3 = Instruction::getModCond(in_RSI);
  bVar6 = (char)iVar3 + 8;
  uVar4 = Instruction::getImm32((Instruction *)0x153346);
  emit32(in_RDI,(uVar4 | (uint)(1L << (bVar6 & 0x3f))) &
                ((uint)(1L << ((char)iVar3 + 7U & 0x3f)) ^ 0xffffffff));
  emit<2ul>(in_RDI,in_stack_ffffffffffffffc8);
  emitByte(in_RDI,bVar1 - 0x40);
  emit32(in_RDI,0xff << (bVar6 & 0x1f));
  emit<2ul>(in_RDI,in_stack_ffffffffffffffc8);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&in_RDI->instructionOffsets,(long)(iVar2 + 1));
  emit32(in_RDI,*pvVar5 - (in_RDI->codePos + 4));
  for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
    in_RDI->registerUsage[local_28] = in_EDX;
  }
  return;
}

Assistant:

void JitCompilerX86::h_CBRANCH(Instruction& instr, int i) {
		int reg = instr.dst;
		int target = registerUsage[reg] + 1;
		emit(REX_ADD_I);
		emitByte(0xc0 + reg);
		int shift = instr.getModCond() + ConditionOffset;
		uint32_t imm = instr.getImm32() | (1UL << shift);
		if (ConditionOffset > 0 || shift > 0)
			imm &= ~(1UL << (shift - 1));
		emit32(imm);
		emit(REX_TEST);
		emitByte(0xc0 + reg);
		emit32(ConditionMask << shift);
		emit(JZ);
		emit32(instructionOffsets[target] - (codePos + 4));
		//mark all registers as used
		for (unsigned j = 0; j < RegistersCount; ++j) {
			registerUsage[j] = i;
		}
	}